

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_log_module.c
# Opt level: O2

uintptr_t ngx_stream_log_escape(u_char *dst,u_char *src,size_t size)

{
  byte bVar1;
  size_t sVar2;
  
  if (dst == (u_char *)0x0) {
    dst = (byte *)0x0;
    for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
      dst = dst + ((ngx_http_log_escape::escape[src[sVar2] >> 5] >> (src[sVar2] & 0x1f) & 1) != 0);
    }
  }
  else {
    for (sVar2 = 0; size != sVar2; sVar2 = sVar2 + 1) {
      bVar1 = src[sVar2];
      if ((ngx_http_log_escape::escape[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0) {
        *dst = bVar1;
        dst = dst + 1;
      }
      else {
        dst[0] = 0x5c;
        dst[1] = 0x78;
        dst[2] = "0123456789ABCDEF"[src[sVar2] >> 4];
        dst[3] = "0123456789ABCDEF"[src[sVar2] & 0xf];
        dst = dst + 4;
      }
    }
  }
  return (uintptr_t)dst;
}

Assistant:

static uintptr_t
ngx_stream_log_escape(u_char *dst, u_char *src, size_t size)
{
    ngx_uint_t      n;
    static u_char   hex[] = "0123456789ABCDEF";

    static uint32_t   escape[] = {
        0xffffffff, /* 1111 1111 1111 1111  1111 1111 1111 1111 */

                    /* ?>=< ;:98 7654 3210  /.-, +*)( '&%$ #"!  */
        0x00000004, /* 0000 0000 0000 0000  0000 0000 0000 0100 */

                    /* _^]\ [ZYX WVUT SRQP  ONML KJIH GFED CBA@ */
        0x10000000, /* 0001 0000 0000 0000  0000 0000 0000 0000 */

                    /*  ~}| {zyx wvut srqp  onml kjih gfed cba` */
        0x80000000, /* 1000 0000 0000 0000  0000 0000 0000 0000 */

        0xffffffff, /* 1111 1111 1111 1111  1111 1111 1111 1111 */
        0xffffffff, /* 1111 1111 1111 1111  1111 1111 1111 1111 */
        0xffffffff, /* 1111 1111 1111 1111  1111 1111 1111 1111 */
        0xffffffff, /* 1111 1111 1111 1111  1111 1111 1111 1111 */
    };


    if (dst == NULL) {

        /* find the number of the characters to be escaped */

        n = 0;

        while (size) {
            if (escape[*src >> 5] & (1U << (*src & 0x1f))) {
                n++;
            }
            src++;
            size--;
        }

        return (uintptr_t) n;
    }

    while (size) {
        if (escape[*src >> 5] & (1U << (*src & 0x1f))) {
            *dst++ = '\\';
            *dst++ = 'x';
            *dst++ = hex[*src >> 4];
            *dst++ = hex[*src & 0xf];
            src++;

        } else {
            *dst++ = *src++;
        }
        size--;
    }

    return (uintptr_t) dst;
}